

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int getsumalgorithm(xmlattr_list *list)

{
  char *pcVar1;
  int iVar2;
  char *v;
  xmlattr *pxStack_18;
  int alg;
  xmlattr *attr;
  xmlattr_list *list_local;
  
  v._4_4_ = 0;
  for (pxStack_18 = list->first; pxStack_18 != (xmlattr *)0x0; pxStack_18 = pxStack_18->next) {
    iVar2 = strcmp(pxStack_18->name,"style");
    if (iVar2 == 0) {
      pcVar1 = pxStack_18->value;
      if ((((*pcVar1 == 'S') || (*pcVar1 == 's')) && ((pcVar1[1] == 'H' || (pcVar1[1] == 'h')))) &&
         ((((pcVar1[2] == 'A' || (pcVar1[2] == 'a')) && (pcVar1[3] == '1')) && (pcVar1[4] == '\0')))
         ) {
        v._4_4_ = 1;
      }
      if (((*pcVar1 == 'M') || (*pcVar1 == 'm')) &&
         (((pcVar1[1] == 'D' || (pcVar1[1] == 'd')) && ((pcVar1[2] == '5' && (pcVar1[3] == '\0')))))
         ) {
        v._4_4_ = 2;
      }
    }
  }
  return v._4_4_;
}

Assistant:

static int
getsumalgorithm(struct xmlattr_list *list)
{
	struct xmlattr *attr;
	int alg = CKSUM_NONE;

	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "style") == 0) {
			const char *v = attr->value;
			if ((v[0] == 'S' || v[0] == 's') &&
			    (v[1] == 'H' || v[1] == 'h') &&
			    (v[2] == 'A' || v[2] == 'a') &&
			    v[3] == '1' && v[4] == '\0')
				alg = CKSUM_SHA1;
			if ((v[0] == 'M' || v[0] == 'm') &&
			    (v[1] == 'D' || v[1] == 'd') &&
			    v[2] == '5' && v[3] == '\0')
				alg = CKSUM_MD5;
		}
	}
	return (alg);
}